

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::AssertionPrinter::print(AssertionPrinter *this)

{
  bool bVar1;
  size_t sVar2;
  AssertionResult *in_RDI;
  AssertionPrinter *in_stack_00000030;
  AssertionPrinter *in_stack_00000040;
  AssertionPrinter *in_stack_000000b0;
  
  printSourceInfo(in_stack_00000040);
  sVar2 = Counts::total((Counts *)(*(long *)&(in_RDI->m_info).field_0x8 + 0xd8));
  if (sVar2 == 0) {
    std::operator<<(*(ostream **)&in_RDI->m_info,"\n");
  }
  else {
    bVar1 = AssertionResult::isOk(in_RDI);
    if (bVar1) {
      std::operator<<(*(ostream **)&in_RDI->m_info,"\n");
    }
    printResultType(this);
    printOriginalExpression(in_stack_00000030);
    printReconstructedExpression(in_stack_000000b0);
  }
  printMessage(in_stack_000000b0);
  return;
}

Assistant:

void print() const {
                printSourceInfo();
                if( stats.totals.assertions.total() > 0 ) {
                    if( result.isOk() )
                        stream << "\n";
                    printResultType();
                    printOriginalExpression();
                    printReconstructedExpression();
                }
                else {
                    stream << "\n";
                }
                printMessage();
            }